

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void glist_readfrombinbuf(_glist *x,_binbuf *b,char *filename,int selectem)

{
  t_atom *ptVar1;
  word wVar2;
  t_atomtype *ptVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  _glist *in_RAX;
  t_atom *ptVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  t_atom *ptVar11;
  t_symbol *s;
  t_atom *ptVar12;
  t_template *x1;
  t_template *x2;
  long lVar13;
  uint uVar14;
  int indexwas;
  int indexwas_1;
  uint uVar15;
  long lVar16;
  char *in_R8;
  bool bVar17;
  uint local_88;
  uint local_84;
  
  glist_getcanvas(in_RAX);
  local_88 = 0;
  uVar5 = binbuf_getnatom(b);
  uVar9 = (ulong)uVar5;
  ptVar7 = binbuf_getvec(b);
  if (0 < (int)uVar5) {
    if (ptVar7->a_type == A_SEMI) {
      bVar17 = true;
      uVar9 = 0;
    }
    else {
      uVar8 = 0;
      ptVar11 = ptVar7;
      do {
        ptVar11 = ptVar11 + 1;
        if (uVar9 - 1 == uVar8) {
          bVar17 = uVar8 + 1 < uVar9;
          goto LAB_00151aa3;
        }
        uVar8 = uVar8 + 1;
      } while (ptVar11->a_type != A_SEMI);
      bVar17 = uVar8 < uVar9;
      uVar9 = uVar8;
    }
LAB_00151aa3:
    local_88 = (uint)bVar17 + (int)uVar9;
    if ((int)uVar9 == 1) goto LAB_00151af8;
  }
  if ((ptVar7->a_type != A_SYMBOL) &&
     (iVar6 = strcmp(((ptVar7->a_w).w_symbol)->s_name,"data"), iVar6 != 0)) {
    pd_error(x,"%s: file apparently of wrong type",filename);
    return;
  }
LAB_00151af8:
  lVar10 = (long)(int)uVar5;
LAB_00151b3d:
  do {
    ptVar11 = (t_atom *)getbytes(0);
    lVar16 = (long)(int)local_88;
    iVar6 = 0;
    local_84 = local_88;
    if ((int)local_88 < (int)uVar5) {
      bVar17 = true;
      uVar14 = local_88;
      if (ptVar7[lVar16].a_type != A_SEMI) {
        iVar6 = -local_88;
        ptVar12 = ptVar7 + lVar16 + 1;
        lVar13 = lVar16;
        do {
          if (uVar5 + iVar6 == 1) {
            bVar17 = lVar13 + 1 < lVar10;
            uVar14 = uVar5;
            goto LAB_00151bad;
          }
          iVar6 = iVar6 + -1;
          lVar13 = lVar13 + 1;
          ptVar3 = &ptVar12->a_type;
          ptVar12 = ptVar12 + 1;
        } while (*ptVar3 != A_SEMI);
        bVar17 = lVar13 < lVar10;
        uVar14 = -iVar6;
      }
LAB_00151bad:
      local_84 = bVar17 + uVar14;
      iVar6 = uVar14 - local_88;
    }
    if (iVar6 < 2) {
      freebytes(ptVar11,0);
      (*(code *)&LAB_00151e29)();
      return;
    }
    if (iVar6 == 2) {
      if (ptVar7[lVar16].a_type == A_SYMBOL) {
        iVar6 = strcmp((ptVar7[lVar16].a_w.w_symbol)->s_name,"template");
        if ((iVar6 == 0) && (ptVar7[lVar16 + 1].a_type == A_SYMBOL)) goto LAB_00151c56;
      }
      canvas_readerror((int)ptVar7,(t_atom *)(ulong)local_88,2,0x1b1f64,in_R8);
      local_88 = local_84;
      goto LAB_00151b3d;
    }
    canvas_readerror((int)ptVar7,(t_atom *)(ulong)local_88,iVar6,0x1b1f50,in_R8);
LAB_00151c56:
    s = canvas_makebindsym(ptVar7[lVar16 + 1].a_w.w_symbol);
    uVar14 = 0;
LAB_00151c73:
    lVar16 = (long)(int)local_84;
    if ((int)local_84 < (int)uVar5) {
      bVar17 = true;
      uVar15 = local_84;
      if (ptVar7[lVar16].a_type != A_SEMI) {
        iVar6 = -local_84;
        ptVar12 = ptVar7 + lVar16 + 1;
        lVar13 = lVar16;
        do {
          if (uVar5 + iVar6 == 1) {
            bVar17 = lVar13 + 1 < lVar10;
            uVar15 = uVar5;
            goto LAB_00151cdb;
          }
          iVar6 = iVar6 + -1;
          lVar13 = lVar13 + 1;
          ptVar3 = &ptVar12->a_type;
          ptVar12 = ptVar12 + 1;
        } while (*ptVar3 != A_SEMI);
        bVar17 = lVar13 < lVar10;
        uVar15 = -iVar6;
      }
LAB_00151cdb:
      local_88 = bVar17 + uVar15;
      iVar6 = uVar15 - local_84;
    }
    else {
      iVar6 = 0;
      local_88 = local_84;
    }
    if (0xfffffffd < iVar6 - 4U) {
      uVar15 = iVar6 + uVar14;
      uVar9 = (ulong)uVar14;
      ptVar11 = (t_atom *)resizebytes(ptVar11,uVar9 * 0x10,(ulong)uVar15 << 4);
      ptVar12 = ptVar7 + lVar16;
      uVar4 = *(undefined4 *)&ptVar12->field_0x4;
      wVar2 = ptVar12->a_w;
      ptVar1 = ptVar11 + uVar9;
      ptVar1->a_type = ptVar12->a_type;
      *(undefined4 *)&ptVar1->field_0x4 = uVar4;
      ptVar1->a_w = wVar2;
      ptVar12 = ptVar7 + lVar16 + 1;
      uVar4 = *(undefined4 *)&ptVar12->field_0x4;
      wVar2 = ptVar12->a_w;
      ptVar1 = ptVar11 + uVar9 + 1;
      ptVar1->a_type = ptVar12->a_type;
      *(undefined4 *)&ptVar1->field_0x4 = uVar4;
      ptVar1->a_w = wVar2;
      uVar14 = uVar15;
      local_84 = local_88;
      if (iVar6 == 3) {
        uVar4 = *(undefined4 *)&ptVar7[lVar16 + 2].field_0x4;
        wVar2 = ptVar7[lVar16 + 2].a_w;
        ptVar11[uVar9 + 2].a_type = ptVar7[lVar16 + 2].a_type;
        *(undefined4 *)&ptVar11[uVar9 + 2].field_0x4 = uVar4;
        ptVar11[uVar9 + 2].a_w = wVar2;
      }
      goto LAB_00151c73;
    }
    x1 = template_findbyname(s);
    if (x1 == (t_template *)0x0) {
      pd_error((void *)0x0,"%s: template not found in current patch",s->s_name);
      freebytes(ptVar11,(ulong)uVar14 << 4);
      (*(code *)&LAB_00151e24)();
      return;
    }
    x2 = template_new(s,uVar14,ptVar11);
    freebytes(ptVar11,(ulong)uVar14 << 4);
    iVar6 = template_match(x1,x2);
    if (iVar6 == 0) {
      pd_error((void *)0x0,"%s: template doesn\'t match current one",s->s_name);
      pd_free(&x2->t_pdobj);
      (*(code *)&LAB_00151e24)();
      return;
    }
    pd_free(&x2->t_pdobj);
  } while( true );
}

Assistant:

void glist_readfrombinbuf(t_glist *x, const t_binbuf *b, const char *filename, int selectem)
{
    t_canvas *canvas = glist_getcanvas(x);
    int natoms, nline, message, nextmsg = 0;
    t_atom *vec;

    natoms = binbuf_getnatom(b);
    vec = binbuf_getvec(b);


            /* check for file type */
    nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
    if (nline != 1 && vec[message].a_type != A_SYMBOL &&
        strcmp(vec[message].a_w.w_symbol->s_name, "data"))
    {
        pd_error(x, "%s: file apparently of wrong type", filename);
        return;
    }
        /* read in templates and check for consistency */
    while (1)
    {
        t_template *newtemplate, *existtemplate;
        t_symbol *templatesym;
        t_atom *templateargs = getbytes(0);
        int ntemplateargs = 0, newnargs;
        nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
        if (nline < 2)
        {
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            break;
        }
        else if (nline > 2)
            canvas_readerror(natoms, vec, message, nline,
                "extra items ignored");
        else if (vec[message].a_type != A_SYMBOL ||
            strcmp(vec[message].a_w.w_symbol->s_name, "template") ||
            vec[message + 1].a_type != A_SYMBOL)
        {
            canvas_readerror(natoms, vec, message, nline,
                "bad template header");
            continue;
        }
        templatesym = canvas_makebindsym(vec[message + 1].a_w.w_symbol);
        while (1)
        {
            nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
            if (nline != 2 && nline != 3)
                break;
            newnargs = ntemplateargs + nline;
            templateargs = (t_atom *)t_resizebytes(templateargs,
                sizeof(*templateargs) * ntemplateargs,
                sizeof(*templateargs) * newnargs);
            templateargs[ntemplateargs] = vec[message];
            templateargs[ntemplateargs + 1] = vec[message + 1];
            if (nline == 3)
                templateargs[ntemplateargs + 2] = vec[message + 2];
            ntemplateargs = newnargs;
        }
        if (!(existtemplate = template_findbyname(templatesym)))
        {
            pd_error(0, "%s: template not found in current patch",
                templatesym->s_name);
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            return;
        }
        newtemplate = template_new(templatesym, ntemplateargs, templateargs);
        t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
        if (!template_match(existtemplate, newtemplate))
        {
            pd_error(0, "%s: template doesn't match current one",
                templatesym->s_name);
            pd_free(&newtemplate->t_pdobj);
            return;
        }
        pd_free(&newtemplate->t_pdobj);
    }
    while (nextmsg < natoms)
    {
        canvas_readscalar(x, natoms, vec, &nextmsg, selectem);
    }
}